

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUpsize.c
# Opt level: O1

int Abc_SclFindUpsizes(SC_Man *p,Vec_Int_t *vPathNodes,int Ratio,int Notches,int iIter,int DelayGap,
                      int fMoreConserf)

{
  uint *puVar1;
  Vec_Que_t *pVVar2;
  Abc_Obj_t *pAVar3;
  Vec_Ptr_t *pVVar4;
  void *pvVar5;
  SC_Cell *pNew;
  int iVar6;
  uint uVar7;
  Vec_Int_t *pVVar8;
  int *piVar9;
  Vec_Int_t *vEvals_00;
  Vec_Ptr_t *pVVar10;
  void **ppvVar11;
  int iVar12;
  long lVar13;
  char *__function;
  int iVar14;
  ulong uVar15;
  SC_Cell *pOld;
  char *__file;
  long lVar16;
  bool bVar17;
  float dGainBest;
  Vec_Int_t *vEvals;
  Vec_Int_t *vRecalcs;
  float local_54;
  float local_44;
  Vec_Int_t *local_40;
  Vec_Int_t *local_38;
  
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  pVVar8->nCap = 100;
  pVVar8->nSize = 0;
  piVar9 = (int *)malloc(400);
  pVVar8->pArray = piVar9;
  local_38 = pVVar8;
  vEvals_00 = (Vec_Int_t *)malloc(0x10);
  vEvals_00->nCap = 100;
  vEvals_00->nSize = 0;
  piVar9 = (int *)malloc(400);
  vEvals_00->pArray = piVar9;
  pVVar2 = p->vNodeByGain;
  piVar9 = pVVar2->pHeap;
  local_40 = vEvals_00;
  if (*piVar9 != -1) {
    __assert_fail("p->pHeap[0] == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                  ,0x71,"void Vec_QueClear(Vec_Que_t *)");
  }
  if (1 < pVVar2->nSize) {
    uVar15 = 1;
    do {
      lVar16 = (long)piVar9[uVar15];
      if ((lVar16 < 0) || (uVar15 != (uint)pVVar2->pOrder[lVar16])) {
        __assert_fail("p->pHeap[i] >= 0 && p->pOrder[p->pHeap[i]] == i",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                      ,0x74,"void Vec_QueClear(Vec_Que_t *)");
      }
      pVVar2->pOrder[lVar16] = -1;
      piVar9[uVar15] = -1;
      uVar15 = uVar15 + 1;
    } while ((long)uVar15 < (long)pVVar2->nSize);
  }
  pVVar2->nSize = 1;
  if (0 < vPathNodes->nSize) {
    lVar16 = 0;
    do {
      iVar6 = vPathNodes->pArray[lVar16];
      if (((long)iVar6 < 0) || (pVVar10 = p->pNtk->vObjs, pVVar10->nSize <= iVar6))
      goto LAB_0047599a;
      pAVar3 = (Abc_Obj_t *)pVVar10->pArray[iVar6];
      if (pAVar3 != (Abc_Obj_t *)0x0) {
        if ((pAVar3->field_0x14 & 0x20) != 0) {
          __assert_fail("pObj->fMarkB == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclUpsize.c"
                        ,0x263,
                        "int Abc_SclFindUpsizes(SC_Man *, Vec_Int_t *, int, int, int, int, int)");
        }
        iVar6 = pAVar3->Id;
        if (((long)iVar6 < 0) || (p->vNodeIter->nSize <= iVar6)) goto LAB_004759b9;
        iVar6 = p->vNodeIter->pArray[iVar6];
        if (iVar6 < 0 || iVar6 + 5 <= iIter) {
          Abc_SclFindNodesToUpdate(pAVar3,&local_38,&local_40,(Abc_Obj_t *)0x0);
          if (vEvals_00->nSize < 1) {
            __assert_fail("Vec_IntSize(vEvals) > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclUpsize.c"
                          ,0x269,
                          "int Abc_SclFindUpsizes(SC_Man *, Vec_Int_t *, int, int, int, int, int)");
          }
          iVar6 = Abc_SclFindBestCell(p,pAVar3,pVVar8,vEvals_00,Notches,DelayGap,&local_44);
          if (-1 < iVar6) {
            if (local_44 <= 0.0) {
              __assert_fail("dGainBest > 0.0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclUpsize.c"
                            ,0x26f,
                            "int Abc_SclFindUpsizes(SC_Man *, Vec_Int_t *, int, int, int, int, int)"
                           );
            }
            iVar14 = pAVar3->Id;
            lVar13 = (long)iVar14;
            if ((lVar13 < 0) || (p->vNode2Gain->nSize <= iVar14)) {
              __file = 
              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
              ;
              __function = "void Vec_FltWriteEntry(Vec_Flt_t *, int, float)";
              goto LAB_004759af;
            }
            p->vNode2Gain->pArray[lVar13] = local_44;
            if (p->vNode2Gate->nSize <= iVar14) goto LAB_00475a16;
            p->vNode2Gate->pArray[lVar13] = iVar6;
            Vec_QuePush(p->vNodeByGain,pAVar3->Id);
          }
        }
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < vPathNodes->nSize);
  }
  if (pVVar8->pArray != (int *)0x0) {
    free(pVVar8->pArray);
    pVVar8->pArray = (int *)0x0;
  }
  free(pVVar8);
  if (vEvals_00->pArray != (int *)0x0) {
    free(vEvals_00->pArray);
    vEvals_00->pArray = (int *)0x0;
  }
  free(vEvals_00);
  iVar6 = p->vNodeByGain->nSize;
  if (iVar6 < 1) {
LAB_00475a35:
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                  ,0x88,"int Vec_QueSize(Vec_Que_t *)");
  }
  iVar6 = iVar6 + -1;
  if (iVar6 == 0) {
    iVar6 = 0;
  }
  else {
    iVar12 = (int)((double)vPathNodes->nSize * (double)Ratio * 0.01);
    iVar14 = 1;
    if (1 < iVar12) {
      iVar14 = iVar12;
    }
    if (iVar6 < iVar14) {
      iVar14 = iVar6;
    }
    pVVar10 = (Vec_Ptr_t *)malloc(0x10);
    pVVar10->nCap = 100;
    pVVar10->nSize = 0;
    ppvVar11 = (void **)malloc(800);
    pVVar10->pArray = ppvVar11;
    iVar6 = 0;
    local_54 = -1.0;
    do {
      iVar12 = p->vNodeByGain->nSize;
      if (iVar12 < 1) goto LAB_00475a35;
      if (iVar12 == 1) break;
      uVar7 = Vec_QuePop(p->vNodeByGain);
      if (((int)uVar7 < 0) || (pVVar4 = p->pNtk->vObjs, pVVar4->nSize <= (int)uVar7))
      goto LAB_0047599a;
      pAVar3 = (Abc_Obj_t *)pVVar4->pArray[uVar7];
      if ((pAVar3->field_0x14 & 0x10) == 0) {
        __assert_fail("pObj->fMarkA",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclUpsize.c"
                      ,0x29d,
                      "int Abc_SclFindUpsizes(SC_Man *, Vec_Int_t *, int, int, int, int, int)");
      }
      iVar12 = Abc_SclObjCheckMarkedFanFans(pAVar3);
      if (iVar12 == 0) {
        Abc_SclObjMarkFanFans(pAVar3,pVVar10);
        if ((local_54 == -1.0) && (!NAN(local_54))) {
          if (p->vNode2Gain->nSize <= (int)uVar7) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                          ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
          }
          local_54 = p->vNode2Gain->pArray[uVar7];
        }
        iVar12 = pAVar3->Id;
        lVar16 = (long)iVar12;
        if (lVar16 < 0) {
LAB_004759b9:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        pVVar8 = pAVar3->pNtk->vGates;
        if (pVVar8->nSize <= iVar12) goto LAB_004759b9;
        piVar9 = pVVar8->pArray;
        uVar7 = piVar9[lVar16];
        if ((ulong)uVar7 == 0xffffffff) {
          pOld = (SC_Cell *)0x0;
        }
        else {
          if (((int)uVar7 < 0) ||
             (pvVar5 = pAVar3->pNtk->pSCLib, *(int *)((long)pvVar5 + 100) <= (int)uVar7)) {
LAB_0047599a:
            __file = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
            ;
            __function = "void *Vec_PtrEntry(Vec_Ptr_t *, int)";
LAB_004759af:
            __assert_fail("i >= 0 && i < p->nSize",__file,0x184,__function);
          }
          pOld = *(SC_Cell **)(*(long *)((long)pvVar5 + 0x68) + (ulong)uVar7 * 8);
        }
        if (p->vNode2Gate->nSize <= iVar12) goto LAB_004759b9;
        iVar12 = p->vNode2Gate->pArray[lVar16];
        if (((long)iVar12 < 0) || ((p->pLib->vCells).nSize <= iVar12)) goto LAB_0047599a;
        pNew = (SC_Cell *)(p->pLib->vCells).pArray[iVar12];
        if (pNew == (SC_Cell *)0x0) {
          __assert_fail("pCellNew != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclUpsize.c"
                        ,0x2ab,
                        "int Abc_SclFindUpsizes(SC_Man *, Vec_Int_t *, int, int, int, int, int)");
        }
        p->SumArea = (pNew->area - pOld->area) + p->SumArea;
        piVar9[lVar16] = pNew->Id;
        Abc_SclUpdateLoad(p,pAVar3,pOld,pNew);
        Vec_IntPush(p->vUpdates,pAVar3->Id);
        Vec_IntPush(p->vUpdates,pNew->Id);
        Abc_SclTimeIncInsert(p,pAVar3);
        iVar12 = pAVar3->Id;
        if (((long)iVar12 < 0) || (p->vNodeIter->nSize <= iVar12)) {
LAB_00475a16:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        p->vNodeIter->pArray[iVar12] = iIter;
        iVar6 = iVar6 + 1;
        bVar17 = iVar6 == iVar14;
      }
      else {
        bVar17 = false;
      }
    } while (!bVar17);
    iVar14 = pVVar10->nSize;
    if (0 < (long)iVar14) {
      ppvVar11 = pVVar10->pArray;
      lVar16 = 0;
      do {
        puVar1 = (uint *)((long)ppvVar11[lVar16] + 0x14);
        *puVar1 = *puVar1 & 0xffffffdf;
        lVar16 = lVar16 + 1;
      } while (iVar14 != lVar16);
    }
    if (pVVar10->pArray != (void **)0x0) {
      free(pVVar10->pArray);
      pVVar10->pArray = (void **)0x0;
    }
    free(pVVar10);
  }
  return iVar6;
}

Assistant:

int Abc_SclFindUpsizes( SC_Man * p, Vec_Int_t * vPathNodes, int Ratio, int Notches, int iIter, int DelayGap, int fMoreConserf )
{
    SC_Cell * pCellOld, * pCellNew;
    Vec_Int_t * vRecalcs, * vEvals;
    Vec_Ptr_t * vFanouts;
    Abc_Obj_t * pObj;
    float dGainBest, dGainBest2;
    int i, gateBest, Limit, Counter, iIterLast;

    // compute savings due to upsizing each node
    vRecalcs = Vec_IntAlloc( 100 );
    vEvals = Vec_IntAlloc( 100 );
    Vec_QueClear( p->vNodeByGain );
    Abc_NtkForEachObjVec( vPathNodes, p->pNtk, pObj, i )
    {
        assert( pObj->fMarkB == 0 );
        iIterLast = Vec_IntEntry(p->vNodeIter, Abc_ObjId(pObj));
        if ( iIterLast >= 0 && iIterLast + 5 > iIter )
            continue;
        // compute nodes to recalculate timing and nodes to evaluate afterwards
        Abc_SclFindNodesToUpdate( pObj, &vRecalcs, &vEvals, NULL );
        assert( Vec_IntSize(vEvals) > 0 );
        //printf( "%d -> %d\n", Vec_IntSize(vRecalcs), Vec_IntSize(vEvals) );
        gateBest = Abc_SclFindBestCell( p, pObj, vRecalcs, vEvals, Notches, DelayGap, &dGainBest );
        // remember savings
        if ( gateBest >= 0 )
        {
            assert( dGainBest > 0.0 );
            Vec_FltWriteEntry( p->vNode2Gain, Abc_ObjId(pObj), dGainBest );
            Vec_IntWriteEntry( p->vNode2Gate, Abc_ObjId(pObj), gateBest );
            Vec_QuePush( p->vNodeByGain, Abc_ObjId(pObj) );
        }
    }
    Vec_IntFree( vRecalcs );
    Vec_IntFree( vEvals );
    if ( Vec_QueSize(p->vNodeByGain) == 0 )
        return 0;
/*
    Limit = Abc_MinInt( Vec_QueSize(p->vNodeByGain), Abc_MaxInt((int)(0.01 * Ratio * Vec_IntSize(vPathNodes)), 1) ); 
    //printf( "\nSelecting %d out of %d\n", Limit, Vec_QueSize(p->vNodeByGain) );
    for ( i = 0; i < Limit; i++ )
    {
        // get the object
        pObj = Abc_NtkObj( p->pNtk, Vec_QuePop(p->vNodeByGain) );
        assert( pObj->fMarkA );
        // find old and new gates
        pCellOld = Abc_SclObjCell( pObj );
        pCellNew = SC_LibCell( p->pLib, Vec_IntEntry(p->vNode2Gate, Abc_ObjId(pObj)) );
        assert( pCellNew != NULL );
        //printf( "%6d  %20s -> %20s  ", Abc_ObjId(pObj), pCellOld->pName, pCellNew->pName );
        //printf( "gain is %f\n", Vec_FltEntry(p->vNode2Gain, Abc_ObjId(pObj)) );
        // update gate
        Abc_SclUpdateLoad( p, pObj, pCellOld, pCellNew );
        p->SumArea += pCellNew->area - pCellOld->area;
        Abc_SclObjSetCell( pObj, pCellNew );
        // record the update
        Vec_IntPush( p->vUpdates, Abc_ObjId(pObj) );
        Vec_IntPush( p->vUpdates, pCellNew->Id );
        Abc_SclTimeIncInsert( p, pObj );
        // remember when this node was upsized
        Vec_IntWriteEntry( p->vNodeIter, Abc_ObjId(pObj), iIter );
    }
return Limit;
*/

    Limit = Abc_MinInt( Vec_QueSize(p->vNodeByGain), Abc_MaxInt((int)(0.01 * Ratio * Vec_IntSize(vPathNodes)), 1) ); 
    dGainBest2 = -1;
    Counter = 0;
    vFanouts = Vec_PtrAlloc( 100 );
    while ( Vec_QueSize(p->vNodeByGain) )
    {
        int iNode = Vec_QuePop(p->vNodeByGain);
        Abc_Obj_t * pObj = Abc_NtkObj( p->pNtk, iNode );
        assert( pObj->fMarkA );
        if ( Abc_SclObjCheckMarkedFanFans( pObj ) )
            continue;
        Abc_SclObjMarkFanFans( pObj, vFanouts );
        // remember gain
        if ( dGainBest2 == -1 )
            dGainBest2 = Vec_FltEntry(p->vNode2Gain, iNode);
//        else if ( dGainBest2 > 3*Vec_FltEntry(p->vNode2Gain, iNode) )
//            break;
//        printf( "%.1f ", Vec_FltEntry(p->vNode2Gain, iNode) );

        // find old and new gates
        pCellOld = Abc_SclObjCell( pObj );
        pCellNew = SC_LibCell( p->pLib, Vec_IntEntry(p->vNode2Gate, Abc_ObjId(pObj)) );
        assert( pCellNew != NULL );
        //printf( "%6d  %20s -> %20s  ", Abc_ObjId(pObj), pCellOld->pName, pCellNew->pName );
        //printf( "gain is %f\n", Vec_FltEntry(p->vNode2Gain, Abc_ObjId(pObj)) );
//        if ( pCellOld->Order > 0 )
//            printf( "%.2f  %d -> %d(%d)   ", Vec_FltEntry(p->vNode2Gain, iNode), pCellOld->Order, pCellNew->Order, pCellNew->nGates );
        // update gate
        p->SumArea += pCellNew->area - pCellOld->area;
        Abc_SclObjSetCell( pObj, pCellNew );
        Abc_SclUpdateLoad( p, pObj, pCellOld, pCellNew );
        // record the update
        Vec_IntPush( p->vUpdates, Abc_ObjId(pObj) );
        Vec_IntPush( p->vUpdates, pCellNew->Id );
        Abc_SclTimeIncInsert( p, pObj );
        // remember when this node was upsized
        Vec_IntWriteEntry( p->vNodeIter, Abc_ObjId(pObj), iIter );
        Counter++;
        if ( Counter == Limit )
            break;
    }
//    printf( "\n" );

    Vec_PtrForEachEntry( Abc_Obj_t *, vFanouts, pObj, i )
        pObj->fMarkB = 0;
    Vec_PtrFree( vFanouts );
    return Counter;
}